

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

__m256i * av1_half_btf_avx2(__m256i *w0,__m256i *n0,__m256i *w1,__m256i *n1,__m256i *rounding,
                           int bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  uint in_R9D;
  __m256i y;
  __m256i x;
  
  auVar1 = vpmulld_avx2(*in_RDI,*in_RSI);
  auVar2 = vpmulld_avx2(*in_RDX,*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar1 = vpaddd_avx2(auVar1,*in_R8);
  vpsrad_avx2(auVar1,ZEXT416(in_R9D));
  return (__m256i *)(ulong)in_R9D;
}

Assistant:

static inline __m256i av1_half_btf_avx2(const __m256i *w0, const __m256i *n0,
                                        const __m256i *w1, const __m256i *n1,
                                        const __m256i *rounding, int bit) {
  __m256i x, y;

  x = _mm256_mullo_epi32(*w0, *n0);
  y = _mm256_mullo_epi32(*w1, *n1);
  x = _mm256_add_epi32(x, y);
  x = _mm256_add_epi32(x, *rounding);
  x = _mm256_srai_epi32(x, bit);
  return x;
}